

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O1

void __thiscall
FNodeBuilder::PushConnectingGLSeg
          (FNodeBuilder *this,int subsector,
          TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,vertex_t *v1,vertex_t *v2)

{
  side_t **ppsVar1;
  sector_t_conflict **ppsVar2;
  uint uVar3;
  glseg_t *pgVar4;
  
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Grow(segs,1);
  pgVar4 = segs->Array;
  uVar3 = segs->Count;
  pgVar4[uVar3].super_seg_t.v1 = v1;
  pgVar4[uVar3].super_seg_t.v2 = v2;
  ppsVar1 = &pgVar4[uVar3].super_seg_t.sidedef;
  *ppsVar1 = (side_t *)0x0;
  ppsVar1[1] = (side_t *)0x0;
  ppsVar2 = &pgVar4[uVar3].super_seg_t.frontsector;
  *ppsVar2 = (sector_t_conflict *)0x0;
  ppsVar2[1] = (sector_t_conflict *)0x0;
  pgVar4[uVar3].Partner = 0xffffffff;
  segs->Count = segs->Count + 1;
  return;
}

Assistant:

void FNodeBuilder::PushConnectingGLSeg (int subsector, TArray<glseg_t> &segs, vertex_t *v1, vertex_t *v2)
{
	glseg_t newseg;

	newseg.v1 = v1;
	newseg.v2 = v2;
	newseg.backsector = NULL;
	newseg.frontsector = NULL;
	newseg.linedef = NULL;
	newseg.sidedef = NULL;
	newseg.Partner = DWORD_MAX;
	segs.Push (newseg);
}